

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_function.hpp
# Opt level: O1

scalar_function_t * __thiscall
duckdb::ScalarFunction::GetScalarUnaryFunctionFixedReturn<signed_char,duckdb::SignOperator>
          (scalar_function_t *__return_storage_ptr__,ScalarFunction *this,LogicalType *type)

{
  BaseScalarFunction BVar1;
  InternalException *this_00;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *local_48 [2];
  undefined1 local_38 [16];
  
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  BVar1 = this->super_BaseScalarFunction;
  switch(BVar1) {
  case (BaseScalarFunction)0xb:
    local_48[0] = UnaryFunction<signed_char,signed_char,duckdb::SignOperator>;
    break;
  case (BaseScalarFunction)0xc:
    local_48[0] = UnaryFunction<short,signed_char,duckdb::SignOperator>;
    break;
  case (BaseScalarFunction)0xd:
    local_48[0] = UnaryFunction<int,signed_char,duckdb::SignOperator>;
    break;
  case (BaseScalarFunction)0xe:
    local_48[0] = UnaryFunction<long,signed_char,duckdb::SignOperator>;
    break;
  case (BaseScalarFunction)0xf:
  case (BaseScalarFunction)0x10:
  case (BaseScalarFunction)0x11:
  case (BaseScalarFunction)0x12:
  case (BaseScalarFunction)0x13:
  case (BaseScalarFunction)0x14:
  case (BaseScalarFunction)0x15:
  case (BaseScalarFunction)0x18:
  case (BaseScalarFunction)0x19:
  case (BaseScalarFunction)0x1a:
  case (BaseScalarFunction)0x1b:
switchD_006ca11e_caseD_f:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_48[0] = (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,"Unimplemented type for GetScalarUnaryFunctionFixedReturn","");
    duckdb::InternalException::InternalException(this_00,(string *)local_48);
    __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  case (BaseScalarFunction)0x16:
    local_48[0] = UnaryFunction<float,signed_char,duckdb::SignOperator>;
    break;
  case (BaseScalarFunction)0x17:
    local_48[0] = UnaryFunction<double,signed_char,duckdb::SignOperator>;
    break;
  case (BaseScalarFunction)0x1c:
    local_48[0] = UnaryFunction<unsigned_char,signed_char,duckdb::SignOperator>;
    break;
  case (BaseScalarFunction)0x1d:
    local_48[0] = UnaryFunction<unsigned_short,signed_char,duckdb::SignOperator>;
    break;
  case (BaseScalarFunction)0x1e:
    local_48[0] = UnaryFunction<unsigned_int,signed_char,duckdb::SignOperator>;
    break;
  case (BaseScalarFunction)0x1f:
    local_48[0] = UnaryFunction<unsigned_long,signed_char,duckdb::SignOperator>;
    break;
  default:
    if (BVar1 == (BaseScalarFunction)0x31) {
      local_48[0] = UnaryFunction<duckdb::uhugeint_t,signed_char,duckdb::SignOperator>;
    }
    else {
      if (BVar1 != (BaseScalarFunction)0x32) goto switchD_006ca11e_caseD_f;
      local_48[0] = UnaryFunction<duckdb::hugeint_t,signed_char,duckdb::SignOperator>;
    }
  }
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
            ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
             __return_storage_ptr__,local_48);
  return __return_storage_ptr__;
}

Assistant:

static scalar_function_t GetScalarUnaryFunctionFixedReturn(const LogicalType &type) {
		scalar_function_t function;
		switch (type.id()) {
		case LogicalTypeId::TINYINT:
			function = &ScalarFunction::UnaryFunction<int8_t, TR, OP>;
			break;
		case LogicalTypeId::SMALLINT:
			function = &ScalarFunction::UnaryFunction<int16_t, TR, OP>;
			break;
		case LogicalTypeId::INTEGER:
			function = &ScalarFunction::UnaryFunction<int32_t, TR, OP>;
			break;
		case LogicalTypeId::BIGINT:
			function = &ScalarFunction::UnaryFunction<int64_t, TR, OP>;
			break;
		case LogicalTypeId::UTINYINT:
			function = &ScalarFunction::UnaryFunction<uint8_t, TR, OP>;
			break;
		case LogicalTypeId::USMALLINT:
			function = &ScalarFunction::UnaryFunction<uint16_t, TR, OP>;
			break;
		case LogicalTypeId::UINTEGER:
			function = &ScalarFunction::UnaryFunction<uint32_t, TR, OP>;
			break;
		case LogicalTypeId::UBIGINT:
			function = &ScalarFunction::UnaryFunction<uint64_t, TR, OP>;
			break;
		case LogicalTypeId::HUGEINT:
			function = &ScalarFunction::UnaryFunction<hugeint_t, TR, OP>;
			break;
		case LogicalTypeId::UHUGEINT:
			function = &ScalarFunction::UnaryFunction<uhugeint_t, TR, OP>;
			break;
		case LogicalTypeId::FLOAT:
			function = &ScalarFunction::UnaryFunction<float, TR, OP>;
			break;
		case LogicalTypeId::DOUBLE:
			function = &ScalarFunction::UnaryFunction<double, TR, OP>;
			break;
		default:
			throw InternalException("Unimplemented type for GetScalarUnaryFunctionFixedReturn");
		}
		return function;
	}